

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

void __thiscall smf::Options::xverify(Options *this,int error_check,int suppress)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char cVar1;
  pointer pbVar2;
  pointer pcVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int local_3c;
  int running;
  int position;
  
  this->m_options_error_check = error_check;
  local_3c = 1;
  this->m_suppressQ = (uint)(suppress != 0);
  this_00 = &this->m_argument;
  if ((this->m_argument).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_argument).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(this_00);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,(this->m_oargv).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  position = 0;
  running = 0;
  iVar5 = 1;
LAB_00112160:
  do {
    iVar8 = this->m_oargc;
    if (iVar8 <= iVar5) {
LAB_001121ef:
      lVar6 = (long)iVar5;
      lVar7 = lVar6 << 5;
      for (; lVar6 < iVar8; lVar6 = lVar6 + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this_00,(value_type *)
                            ((long)&(((this->m_oargv).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar7));
        iVar8 = this->m_oargc;
        lVar7 = lVar7 + 0x20;
      }
      return;
    }
    pbVar2 = (this->m_oargv).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar4 = optionQ(this,pbVar2 + iVar5,&local_3c);
    iVar5 = local_3c;
    if (iVar4 != 0) {
      local_3c = storeOption(this,local_3c,&position,&running);
      if (local_3c != iVar5) {
        running = 0;
        position = 0;
        iVar5 = local_3c;
      }
      goto LAB_00112160;
    }
    if (pbVar2[local_3c]._M_string_length == 2) {
      pcVar3 = pbVar2[local_3c]._M_dataplus._M_p;
      cVar1 = *pcVar3;
      if ((cVar1 == this->m_optionFlag) && (pcVar3[2] == cVar1)) {
        iVar5 = local_3c + 1;
        goto LAB_001121ef;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_00,pbVar2 + local_3c);
    local_3c = iVar5 + 1;
    iVar5 = local_3c;
  } while( true );
}

Assistant:

void Options::xverify(int error_check, int suppress) {
   m_options_error_check = error_check;
   int gargp = 1;
   int optionend = 0;

   if (suppress) {
      m_suppressQ = 1;
   } else {
      m_suppressQ = 0;
   }

   // if calling xverify again, must remove previous argument list.
   if (m_argument.size() != 0) {
      m_argument.clear();
   }

   m_argument.push_back(m_oargv[0]);
   int oldgargp;
   int position = 0;
   int running = 0;
   while (gargp < m_oargc && optionend == 0) {
      if (optionQ(m_oargv[gargp], gargp)) {
         oldgargp = gargp;
         gargp = storeOption(gargp, position, running);
         if (gargp != oldgargp) {
            running = 0;
            position = 0;
         }
      } else {
         if (m_oargv[gargp].size() == 2 && m_oargv[gargp][0] == getFlag() &&
            m_oargv[gargp][2] == getFlag() ) {
               optionend = 1;
            gargp++;
            break;
         } else {                          // this is an argument
            m_argument.push_back(m_oargv[gargp]);
            gargp++;
         }
      }
   }

   while (gargp < m_oargc) {
      m_argument.push_back(m_oargv[gargp]);
      gargp++;
   }

}